

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoch_tracker.cc
# Opt level: O2

bool __thiscall
sptk::reaper::EpochTracker::GetBandpassedRmsSignal
          (EpochTracker *this,vector<float,_std::allocator<float>_> *input,float sample_rate,
          float low_limit,float high_limit,float frame_interval,float frame_dur,
          vector<float,_std::allocator<float>_> *output_rms)

{
  pointer pfVar1;
  int iVar2;
  size_t i;
  float *output;
  float *y;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  size_t bframe;
  ulong uVar6;
  int iVar7;
  size_t frame;
  ulong size;
  ulong __new_size;
  long lVar8;
  float fVar9;
  double dVar10;
  FFT ft;
  
  iVar2 = (int)(frame_interval * sample_rate + 0.5);
  iVar7 = (int)(frame_dur * sample_rate + 0.5);
  size = (ulong)iVar7;
  uVar6 = (long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(input->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                super__Vector_impl_data._M_start >> 2;
  __new_size = (uVar6 - size) / (ulong)(long)iVar2 + 1;
  if (__new_size < 2) {
    fprintf(_stderr,"input too small (%d) in GetBandpassedRmsSignal\n",uVar6 & 0xffffffff);
    std::vector<float,_std::allocator<float>_>::resize(output_rms,0);
  }
  else {
    std::vector<float,_std::allocator<float>_>::resize(output_rms,__new_size);
    iVar7 = FFT::fft_pow2_from_window_size(iVar7);
    FFT::FFT(&ft,iVar7);
    lVar8 = (long)ft.fftSize;
    uVar6 = 0xffffffffffffffff;
    if (-1 < lVar8) {
      uVar6 = lVar8 * 4;
    }
    output = (float *)operator_new__(uVar6);
    y = (float *)operator_new__(uVar6);
    uVar6 = (long)iVar2 * 2;
    uVar3 = size / uVar6;
    uVar3 = uVar3 + (uVar6 * uVar3 < size);
    for (uVar6 = uVar3; uVar6 < __new_size; uVar6 = uVar6 + 1) {
      Window(this,input,((int)uVar6 - (int)uVar3) * iVar2,size,output);
      for (uVar4 = 0; uVar5 = size, size != uVar4; uVar4 = uVar4 + 1) {
        y[uVar4] = 0.0;
      }
      for (; (long)uVar5 < lVar8; uVar5 = uVar5 + 1) {
        y[uVar5] = 0.0;
        output[uVar5] = 0.0;
      }
      FFT::fft(&ft,output,y);
      fVar9 = FFT::get_band_rms(&ft,output,y,
                                (int)((low_limit * (float)ft.fftSize) / sample_rate + 0.5),
                                (int)((high_limit * (float)ft.fftSize) / sample_rate + 0.5));
      dVar10 = log10((double)fVar9 + 1.0);
      pfVar1 = (output_rms->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pfVar1[uVar6] = (float)(dVar10 * 20.0);
      if (uVar6 == uVar3) {
        for (uVar4 = 0; uVar4 < uVar3; uVar4 = uVar4 + 1) {
          pfVar1[uVar4] = (float)(dVar10 * 20.0);
        }
      }
    }
    operator_delete__(output);
    operator_delete__(y);
    FFT::~FFT(&ft);
  }
  return 1 < __new_size;
}

Assistant:

bool EpochTracker::GetBandpassedRmsSignal(const std::vector<float>& input,
                                          float sample_rate,
                                          float low_limit, float high_limit,
                                          float frame_interval,
                                          float frame_dur,
                                          std::vector<float>* output_rms) {
  size_t frame_step = RoundUp(sample_rate * frame_interval);
  size_t frame_size = RoundUp(sample_rate * frame_dur);
  size_t n_frames = 1 + ((input.size() - frame_size) / frame_step);
  if (n_frames < 2) {
    fprintf(stderr, "input too small (%d) in GetBandpassedRmsSignal\n",
            static_cast<int>(input.size()));
    output_rms->resize(0);
    return false;
  }
  output_rms->resize(n_frames);
  FFT ft(FFT::fft_pow2_from_window_size(frame_size));
  int32_t fft_size = ft.get_fftSize();
  int32_t first_bin = RoundUp(fft_size * low_limit / sample_rate);
  int32_t last_bin = RoundUp(fft_size * high_limit / sample_rate);
  float* re = new float[fft_size];
  float* im = new float[fft_size];
  size_t first_frame = frame_size / (2 * frame_step);
  if ((first_frame * 2 * frame_step) < frame_size) {
    first_frame++;
  }
  for (size_t frame = first_frame; frame < n_frames; ++frame) {
    Window(input, (frame - first_frame) * frame_step, frame_size, re);
    for (size_t i = 0; i < frame_size; ++i) {
      im[i] = 0.0;
    }
    for (int32_t i = frame_size; i < fft_size; ++i) {
      re[i] = im[i] = 0.0;
    }
    ft.fft(re, im);
    float rms = 20.0 *
        log10(1.0 + ft.get_band_rms(re, im, first_bin, last_bin));
    (*output_rms)[frame] = rms;
    if (frame == first_frame) {
      for (size_t bframe = 0; bframe < first_frame; ++bframe) {
        (*output_rms)[bframe] = rms;
      }
    }
  }
  delete [] re;
  delete [] im;
  return true;
}